

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  __pid_t _Var2;
  undefined1 local_1a2 [8];
  utsname uts;
  pid_t child_pid;
  char **argv_local;
  int argc_local;
  
  unique0x100001d3 = argv;
  if (argc < 2) {
    fprintf(_stderr,"Usage: %s <child-hostname>\n",*argv);
    exit(1);
  }
  uts.domainname._57_4_ = clone(childFunc,&_end,0x4000011,argv[1]);
  if (uts.domainname._57_4_ == -1) {
    errExit("clone");
  }
  printf("PID of child created by clone() is %ld\n",(long)(int)uts.domainname._57_4_);
  sleep(1);
  iVar1 = uname((utsname *)local_1a2);
  if (iVar1 == -1) {
    errExit("uname");
  }
  printf("uts.nodename in parent: %s\n",uts.sysname + 0x39);
  printf("uts namespace for parent: ");
  print_link("/proc/self/ns/uts");
  _Var2 = waitpid(uts.domainname._57_4_,(int *)0x0,0);
  if (_Var2 == -1) {
    errExit("waitpid");
  }
  printf("child has terminated\n");
  exit(0);
}

Assistant:

int
main(int argc, char *argv[])
{
    pid_t child_pid;
    struct utsname uts;

    if (argc < 2) {
        fprintf(stderr, "Usage: %s <child-hostname>\n", argv[0]);
        exit(EXIT_FAILURE);
    }

    /* Create a child that has its own UTS namespace;
       the child commences execution in childFunc() */

    child_pid = clone(childFunc,
                      child_stack + STACK_SIZE,   /* Points to start of
                                                     downwardly growing stack */
                      CLONE_NEWUTS | SIGCHLD, argv[1]);
    if (child_pid == -1)
        errExit("clone");
    printf("PID of child created by clone() is %ld\n", (long) child_pid);

    /* Parent falls through to here */

    sleep(1);           /* Give child time to change its hostname */

    /* Display the hostname in parent's UTS namespace. This will be
       different from the hostname in child's UTS namespace. */

    if (uname(&uts) == -1)
        errExit("uname");
    printf("uts.nodename in parent: %s\n", uts.nodename);
    printf("uts namespace for parent: ");
    print_link("/proc/self/ns/uts");

    if (waitpid(child_pid, NULL, 0) == -1)      /* Wait for child */
        errExit("waitpid");
    printf("child has terminated\n");

    exit(EXIT_SUCCESS);
}